

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<float> __thiscall
vkt::shaderexecutor::Functions::Dot<2>::doExpand(Dot<2> *this,ExpandContext *param_1,ArgExprs *args)

{
  int in_ECX;
  SharedPtrStateBase *extraout_RDX;
  ExprP<float> EVar1;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> SStack_58;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_48;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_38;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_28;
  
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&local_48,in_ECX);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&SStack_58,in_ECX + 0x10);
  shaderexecutor::operator*
            ((shaderexecutor *)this,(ExprP<float> *)&local_48,(ExprP<float> *)&SStack_58);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&SStack_58);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_48);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&local_28,in_ECX);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&local_38,in_ECX + 0x10);
  shaderexecutor::operator*
            ((shaderexecutor *)&SStack_58,(ExprP<float> *)&local_28,(ExprP<float> *)&local_38);
  shaderexecutor::operator+
            ((shaderexecutor *)&local_48,(ExprP<float> *)this,(ExprP<float> *)&SStack_58);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::operator=
            ((SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)this,&local_48);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_48);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&SStack_58);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_38);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_28);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state =
       extraout_RDX;
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr =
       (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>;
}

Assistant:

ExprP<float>	doExpand	(ExpandContext&, const ArgExprs& args) const
	{
		ExprP<float> val = args.a[0] * args.b[0];

		for (int ndx = 1; ndx < Size; ++ndx)
			val = val + args.a[ndx] * args.b[ndx];

		return val;
	}